

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall IteratorTest::arithmeticOperatorsTest<true>(IteratorTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_09;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_12;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_13;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_14;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_15;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_16;
  reference piVar1;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar2;
  int i_3;
  uint uVar3;
  int i;
  long lVar4;
  iterator local_238;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_150;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_120;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_f0;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_c0;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_90;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_60;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[lVar4]);
    test((bool *)&local_238);
    local_238.view_ = (view_pointer)0x1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
              (&it,(difference_type *)&local_238);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0x2e);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_00._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[lVar4]);
    test((bool *)&local_238);
    local_238.view_ = (view_pointer)0x1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
              (&it,(difference_type *)&local_238);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0x2e);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  begin_11._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_11._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_11._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_11,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&shape,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_238,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1c0);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[lVar4]);
    test((bool *)&local_238);
    local_238.view_ = (view_pointer)0x1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
              (&it,(difference_type *)&local_238);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&local_238,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                  (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_238);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0x2e);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_01._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar3 = 0x17; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    local_238.view_ = (view_pointer)0x1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
              (&it,(difference_type *)&local_238);
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[uVar3]);
    test((bool *)&local_238);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_02._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_02._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar3 = 0x17; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    local_238.view_ = (view_pointer)0x1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
              (&it,(difference_type *)&local_238);
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[uVar3]);
    test((bool *)&local_238);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  begin_12._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_12._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_12._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_12,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&shape,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_238,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1c0);
  for (uVar3 = 0x17; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    local_238.view_ = (view_pointer)0x1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
              (&it,(difference_type *)&local_238);
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[uVar3]);
    test((bool *)&local_238);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&local_238,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                  (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_238);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_03._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_03._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[lVar4]);
    test((bool *)&local_238);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0x2e);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_04._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_04._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[lVar4]);
    test((bool *)&local_238);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0x2e);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  begin_13._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_13._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_13._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_13,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&shape,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_238,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1c0);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[lVar4]);
    test((bool *)&local_238);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&local_238,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                  (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_238);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0x2e);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_05._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar3 = 0x17; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[uVar3]);
    test((bool *)&local_238);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_06._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_06._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar3 = 0x17; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[uVar3]);
    test((bool *)&local_238);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  begin_14._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_14._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_14._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_14,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&shape,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_238,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1c0);
  for (uVar3 = 0x17; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[uVar3]);
    test((bool *)&local_238);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&local_238,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                  (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_238);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_07._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_07._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[lVar4]);
    test((bool *)&local_238);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_60,&it,0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_60.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0x2e);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_08._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_08._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_08._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[lVar4]);
    test((bool *)&local_238);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_90,&it,0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_90.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0x2e);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  begin_15._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_15._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_15._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_15,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&shape,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_238,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1c0);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[lVar4]);
    test((bool *)&local_238);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_c0,&it,0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_c0.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&local_238,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                  (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_238);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  pIVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&it);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar2);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0x2e);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_09._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_09._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_09._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_09,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar3 = 0x17; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&local_f0,&it,0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_f0.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[uVar3]);
    test((bool *)&local_238);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_10._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_10._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_10._M_current = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin_10,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::end(&local_238,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  for (uVar3 = 0x17; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&local_120,&it,0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_120.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[uVar3]);
    test((bool *)&local_238);
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin(&local_238,&v);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,&local_238);
  test((bool *)&shape_2);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  begin_16._M_current._1_7_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_16._M_current._0_1_ =
       shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_16._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_16,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            ((iterator *)&shape,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_238,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=(&it,&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1c0);
  for (uVar3 = 0x17; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&local_150,&it,0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_150.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
    local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == this->data_[uVar3]);
    test((bool *)&local_238);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)&local_238,(View<int,_false,_std::allocator<unsigned_long>_> *)&v);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                 ((Iterator<int,true,std::allocator<unsigned_long>> *)&it,
                  (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_238);
  test((bool *)&shape);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_238.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  piVar1 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&it);
  local_238.view_ = (view_pointer)CONCAT71(local_238.view_._1_7_,*piVar1 == 0);
  test((bool *)&local_238);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void IteratorTest::arithmeticOperatorsTest(){
    // operator+=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();

        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
}